

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O2

int lj_opt_fwd_href_nokey(jit_State *J)

{
  IRIns *pIVar1;
  ushort uVar2;
  ushort uVar3;
  IRIns *pIVar4;
  AliasRet AVar5;
  IRRef1 *pIVar6;
  
  uVar2 = (J->fold).ins.field_0.op1;
  if ((((J->fold).right[0].field_1.t.irt & 0x1f) == 0xe) && (uVar2 < J->chain[0x3b])) {
    pIVar6 = J->chain + 0x4a;
    while( true ) {
      uVar3 = *pIVar6;
      if (uVar3 <= uVar2) break;
      if (uVar3 < J->chain[0x3b]) {
        return 0;
      }
      pIVar6 = &(&((J->cur).ir)->field_0)[uVar3].prev;
    }
  }
  pIVar6 = J->chain + 0x4b;
  do {
    if (*pIVar6 <= uVar2) {
      return 1;
    }
    pIVar4 = (J->cur).ir;
    pIVar1 = pIVar4 + *pIVar6;
    pIVar6 = &(pIVar1->field_0).prev;
    AVar5 = aa_ahref(J,&(J->fold).ins,pIVar4 + (pIVar1->field_0).op1);
  } while (AVar5 == ALIAS_NO);
  return 0;
}

Assistant:

int LJ_FASTCALL lj_opt_fwd_href_nokey(jit_State *J)
{
  IRRef lim = fins->op1;  /* Search limit. */
  IRRef ref;

  /* The key for an ASTORE may end up in the hash part after a NEWREF. */
  if (irt_isnum(fright->t) && J->chain[IR_NEWREF] > lim) {
    ref = J->chain[IR_ASTORE];
    while (ref > lim) {
      if (ref < J->chain[IR_NEWREF])
	return 0;  /* Conflict. */
      ref = IR(ref)->prev;
    }
  }

  /* Search for conflicting stores. */
  ref = J->chain[IR_HSTORE];
  while (ref > lim) {
    IRIns *store = IR(ref);
    if (aa_ahref(J, fins, IR(store->op1)) != ALIAS_NO)
      return 0;  /* Conflict. */
    ref = store->prev;
  }

  return 1;  /* No conflict. Can fold to niltv. */
}